

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void file_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  uv_loop_t *puVar2;
  uv_fs_t *unaff_RBX;
  uv_fs_t *puVar3;
  long lVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t uStack_928;
  uv_loop_t *puStack_768;
  long lStack_758;
  long lStack_750;
  uv_fs_t uStack_748;
  uv_fs_t uStack_588;
  uv_fs_t uStack_3c8;
  uv_fs_t uStack_208;
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_00188624;
    if (opendir_req.result != -0x14) goto LAB_00188633;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_00188624:
    file_opendir_cb_cold_2();
LAB_00188633:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_768 = (uv_loop_t *)0x18865d;
  cleanup_test_files();
  puStack_768 = (uv_loop_t *)0x188662;
  puVar2 = uv_default_loop();
  puStack_768 = (uv_loop_t *)0x188681;
  iVar1 = uv_fs_mkdir(puVar2,&uStack_208,"test_dir",0x1ed,(uv_fs_cb)0x0);
  uStack_748.data = (void *)(long)iVar1;
  uStack_3c8.data = (void *)0x0;
  if ((uv_loop_t *)uStack_748.data == (uv_loop_t *)0x0) {
    puStack_768 = (uv_loop_t *)0x1886ac;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x1886d1;
    iVar1 = uv_fs_open(puVar2,&uStack_3c8,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    puVar3 = (uv_fs_t *)uStack_3c8.result;
    uStack_748.data = (void *)(long)iVar1;
    uStack_588.data = (void *)0x0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188cb8;
    uStack_748.data = (void *)uStack_3c8.result;
    uStack_588.data = (void *)0x0;
    if (uStack_3c8.result < 0) goto LAB_00188cca;
    puStack_768 = (uv_loop_t *)0x188730;
    uv_fs_req_cleanup(&uStack_3c8);
    puStack_768 = (uv_loop_t *)0x188735;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x188749;
    iVar1 = uv_fs_close(puVar2,&uStack_588,(uv_os_fd_t)puVar3,(uv_fs_cb)0x0);
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188cdc;
    puStack_768 = (uv_loop_t *)0x188776;
    uv_fs_req_cleanup(&uStack_588);
    puStack_768 = (uv_loop_t *)0x18877b;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x1887a0;
    iVar1 = uv_fs_open(puVar2,&uStack_3c8,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188ceb;
    uStack_748.data = (void *)uStack_3c8.result;
    lStack_758 = 0;
    puVar3 = (uv_fs_t *)uStack_3c8.result;
    if (uStack_3c8.result < 0) goto LAB_00188cfa;
    puStack_768 = (uv_loop_t *)0x1887f3;
    uv_fs_req_cleanup(&uStack_3c8);
    puStack_768 = (uv_loop_t *)0x1887f8;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x18880c;
    iVar1 = uv_fs_close(puVar2,&uStack_588,(uv_os_fd_t)uStack_3c8.result,(uv_fs_cb)0x0);
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188d09;
    puStack_768 = (uv_loop_t *)0x188839;
    uv_fs_req_cleanup(&uStack_588);
    puStack_768 = (uv_loop_t *)0x18883e;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x18885d;
    iVar1 = uv_fs_mkdir(puVar2,&uStack_208,"test_dir/test_subdir",0x1ed,(uv_fs_cb)0x0);
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188d18;
    puStack_768 = (uv_loop_t *)0x18888a;
    uv_fs_req_cleanup(&uStack_208);
    puVar3 = &opendir_req;
    puStack_768 = (uv_loop_t *)0x1888a3;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_768 = (uv_loop_t *)0x1888a8;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x1888bc;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",(uv_fs_cb)0x0);
    unaff_RBX = (uv_fs_t *)opendir_req.ptr;
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188d27;
    uStack_748.data = (void *)(long)opendir_req.fs_type;
    lStack_758 = 0x1f;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x1f) goto LAB_00188d36;
    uStack_748.data = (void *)opendir_req.result;
    lStack_758 = 0;
    if (opendir_req.result != 0) goto LAB_00188d45;
    if (opendir_req.ptr == (void *)0x0) goto LAB_00188d54;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)unaff_RBX + 8) = 1;
    puStack_768 = (uv_loop_t *)0x188954;
    uv_fs_req_cleanup(&opendir_req);
    puStack_768 = (uv_loop_t *)0x188959;
    puVar2 = uv_default_loop();
    lVar4 = 0;
    puStack_768 = (uv_loop_t *)0x188970;
    iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)unaff_RBX,(uv_fs_cb)0x0);
    if (iVar1 != 0) {
      lVar4 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_768 = (uv_loop_t *)0x1889a2;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_768 = (uv_loop_t *)0x1889b5;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_001889cc;
          puStack_768 = (uv_loop_t *)0x1889c4;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_001889cc;
LAB_00188c92:
          puStack_768 = (uv_loop_t *)0x188c97;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_00188c97:
          puStack_768 = (uv_loop_t *)0x188ca6;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_00188ca6;
        }
LAB_001889cc:
        puStack_768 = (uv_loop_t *)0x1889d7;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          uStack_748.data = (void *)(ulong)dirents[0].type;
          lStack_758 = 2;
          if ((uv_loop_t *)uStack_748.data == (uv_loop_t *)0x2) goto LAB_00188a24;
          goto LAB_00188c97;
        }
        uStack_748.data = (void *)(ulong)dirents[0].type;
        lStack_758 = 1;
        if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x1) {
          puStack_768 = (uv_loop_t *)0x188c92;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_00188c92;
        }
LAB_00188a24:
        uStack_748.data = (void *)(ulong)dirents[0].type;
        puStack_768 = (uv_loop_t *)0x188a2c;
        uv_fs_req_cleanup(&readdir_req);
        lVar4 = lVar4 + 1;
        puStack_768 = (uv_loop_t *)0x188a34;
        puVar2 = uv_default_loop();
        puStack_768 = (uv_loop_t *)0x188a44;
        iVar1 = uv_fs_readdir(puVar2,&readdir_req,(uv_dir_t *)unaff_RBX,(uv_fs_cb)0x0);
      } while (iVar1 != 0);
    }
    uStack_748.data = (uv_loop_t *)0x3;
    lStack_758 = lVar4;
    if (lVar4 != 3) goto LAB_00188d59;
    puStack_768 = (uv_loop_t *)0x188a76;
    uv_fs_req_cleanup(&readdir_req);
    puStack_768 = (uv_loop_t *)0x188a8f;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_768 = (uv_loop_t *)0x188a94;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x188aa4;
    uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)unaff_RBX,(uv_fs_cb)0x0);
    uStack_748.data = (void *)closedir_req.result;
    lStack_758 = 0;
    if (closedir_req.result != 0) goto LAB_00188d68;
    puStack_768 = (uv_loop_t *)0x188ad5;
    uv_fs_req_cleanup(&closedir_req);
    unaff_RBX = &opendir_req;
    puStack_768 = (uv_loop_t *)0x188aee;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_768 = (uv_loop_t *)0x188af3;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x188b0c;
    iVar1 = uv_fs_opendir(puVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188d77;
    uStack_748.data = (void *)(long)non_empty_opendir_cb_count;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188d86;
    uStack_748.data = (void *)(long)non_empty_closedir_cb_count;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188d95;
    puStack_768 = (uv_loop_t *)0x188b7b;
    puVar2 = uv_default_loop();
    puStack_768 = (uv_loop_t *)0x188b85;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_748.data = (void *)(long)iVar1;
    lStack_758 = 0;
    if ((uv_loop_t *)uStack_748.data != (uv_loop_t *)0x0) goto LAB_00188da4;
    uStack_748.data = (uv_loop_t *)0x1;
    lStack_758 = (long)non_empty_opendir_cb_count;
    if (lStack_758 != 1) goto LAB_00188db3;
    uStack_748.data = (uv_loop_t *)0x1;
    lStack_758 = (long)non_empty_closedir_cb_count;
    if (lStack_758 == 1) {
      puStack_768 = (uv_loop_t *)0x188bf4;
      puVar2 = uv_default_loop();
      puStack_768 = (uv_loop_t *)0x188c0d;
      uv_fs_rmdir(puVar2,&uStack_748,"test_subdir",(uv_fs_cb)0x0);
      puStack_768 = (uv_loop_t *)0x188c15;
      uv_fs_req_cleanup(&uStack_748);
      puStack_768 = (uv_loop_t *)0x188c1a;
      cleanup_test_files();
      puStack_768 = (uv_loop_t *)0x188c1f;
      unaff_RBX = (uv_fs_t *)uv_default_loop();
      puStack_768 = (uv_loop_t *)0x188c33;
      uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_768 = (uv_loop_t *)0x188c3d;
      uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
      lStack_758 = 0;
      puStack_768 = (uv_loop_t *)0x188c4b;
      puVar2 = uv_default_loop();
      puStack_768 = (uv_loop_t *)0x188c53;
      iVar1 = uv_loop_close(puVar2);
      lStack_750 = (long)iVar1;
      if (lStack_758 == lStack_750) {
        puStack_768 = (uv_loop_t *)0x188c6f;
        uv_library_shutdown();
        return;
      }
      goto LAB_00188dd1;
    }
  }
  else {
LAB_00188ca6:
    puStack_768 = (uv_loop_t *)0x188cb8;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_00188cb8:
    puVar3 = unaff_RBX;
    puStack_768 = (uv_loop_t *)0x188cca;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_00188cca:
    puStack_768 = (uv_loop_t *)0x188cdc;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_00188cdc:
    puStack_768 = (uv_loop_t *)0x188ceb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_00188ceb:
    puStack_768 = (uv_loop_t *)0x188cfa;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_00188cfa:
    puStack_768 = (uv_loop_t *)0x188d09;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_00188d09:
    puStack_768 = (uv_loop_t *)0x188d18;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_00188d18:
    puStack_768 = (uv_loop_t *)0x188d27;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_00188d27:
    puStack_768 = (uv_loop_t *)0x188d36;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_00188d36:
    puStack_768 = (uv_loop_t *)0x188d45;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_00188d45:
    unaff_RBX = puVar3;
    puStack_768 = (uv_loop_t *)0x188d54;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_00188d54:
    puStack_768 = (uv_loop_t *)0x188d59;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_00188d59:
    puStack_768 = (uv_loop_t *)0x188d68;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_00188d68:
    puStack_768 = (uv_loop_t *)0x188d77;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_00188d77:
    puStack_768 = (uv_loop_t *)0x188d86;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_00188d86:
    puStack_768 = (uv_loop_t *)0x188d95;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_00188d95:
    puStack_768 = (uv_loop_t *)0x188da4;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_00188da4:
    puStack_768 = (uv_loop_t *)0x188db3;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_00188db3:
    puStack_768 = (uv_loop_t *)0x188dc2;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_768 = (uv_loop_t *)0x188dd1;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_00188dd1:
  puStack_768 = (uv_loop_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_768 = (uv_loop_t *)unaff_RBX;
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_928,"test_dir/file1",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_928);
  uv_fs_unlink((uv_loop_t *)0x0,&uStack_928,"test_dir/file2",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_928);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_928,"test_dir/test_subdir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_928);
  uv_fs_rmdir((uv_loop_t *)0x0,&uStack_928,"test_dir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStack_928);
  return;
}

Assistant:

static void file_opendir_cb(uv_fs_t* req) {
  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(req->result, UV_ENOTDIR);
  ASSERT_NULL(req->ptr);

  uv_fs_req_cleanup(req);
  ++file_opendir_cb_count;
}